

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise3d.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise3D::forward
          (ConvolutionDepthWise3D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  float *pfVar4;
  void *pvVar5;
  int *piVar6;
  ConvolutionDepthWise3D *pCVar7;
  int iVar8;
  pointer piVar9;
  uint uVar10;
  uint uVar11;
  uint _h;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  void *pvVar15;
  int iVar16;
  int iVar17;
  size_type __n;
  ulong uVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  int iVar29;
  void *pvVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  vector<int,_std::allocator<int>_> _space_ofs;
  Option opt_pad;
  void *local_1e8;
  allocator_type local_1d9;
  size_t local_1d8;
  ulong local_1d0;
  void *local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  ConvolutionDepthWise3D *local_1b0;
  void *local_1a8;
  ulong local_1a0;
  ulong local_198;
  float *local_190;
  ulong local_188;
  Option *local_180;
  ulong local_178;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  ulong local_158;
  ulong local_150;
  void *local_148;
  int local_13c;
  undefined1 local_138 [16];
  void *local_120;
  ulong local_118;
  ulong local_110;
  Mat local_108;
  undefined1 local_b8 [16];
  long local_a8;
  void *local_a0;
  ulong local_98;
  vector<int,_std::allocator<int>_> local_90;
  Option local_78;
  
  uVar11 = bottom_blob->c;
  pvVar15 = (void *)bottom_blob->elemsize;
  iVar26 = this->kernel_w;
  iVar29 = this->kernel_h;
  iVar14 = this->dilation_w;
  iVar24 = this->dilation_h;
  iVar2 = this->kernel_d;
  iVar16 = this->dilation_d;
  local_108.cstep = 0;
  local_108.data = (void *)0x0;
  local_108.refcount._0_4_ = 0;
  local_108.refcount._4_4_ = 0;
  local_108.elemsize._0_4_ = 0;
  local_108.elemsize._4_4_ = 0;
  local_108.elempack = 0;
  local_108.allocator = (Allocator *)0x0;
  local_108.dims = 0;
  local_108.w = 0;
  local_108.h = 0;
  local_108.d = 0;
  local_108.c = 0;
  local_78.lightmode = opt->lightmode;
  local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
  local_78.num_threads = opt->num_threads;
  local_78.blob_allocator = opt->blob_allocator;
  local_78.workspace_allocator = opt->workspace_allocator;
  local_78.openmp_blocktime = opt->openmp_blocktime;
  local_78.use_winograd_convolution = opt->use_winograd_convolution;
  local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
  local_78.use_int8_inference = opt->use_int8_inference;
  local_78.use_vulkan_compute = opt->use_vulkan_compute;
  uVar18._0_1_ = opt->use_bf16_storage;
  uVar18._1_1_ = opt->use_fp16_packed;
  uVar18._2_1_ = opt->use_fp16_storage;
  uVar18._3_1_ = opt->use_fp16_arithmetic;
  uVar18._4_1_ = opt->use_int8_packed;
  uVar18._5_1_ = opt->use_int8_storage;
  uVar18._6_1_ = opt->use_int8_arithmetic;
  uVar18._7_1_ = opt->use_packing_layout;
  local_78.use_shader_pack8 = opt->use_shader_pack8;
  local_78.use_subgroup_basic = opt->use_subgroup_basic;
  local_78.use_subgroup_vote = opt->use_subgroup_vote;
  local_78.use_subgroup_ballot = opt->use_subgroup_ballot;
  local_78.use_subgroup_shuffle = opt->use_subgroup_shuffle;
  local_78.use_image_storage = opt->use_image_storage;
  local_78.use_tensor_storage = opt->use_tensor_storage;
  local_78.use_weight_fp16_storage = opt->use_weight_fp16_storage;
  local_78.flush_denormals = opt->flush_denormals;
  local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
  local_78.use_reserved_1 = opt->use_reserved_1;
  local_78.use_reserved_2 = opt->use_reserved_2;
  local_78.use_reserved_3 = opt->use_reserved_3;
  local_78.use_reserved_4 = opt->use_reserved_4;
  local_78.use_reserved_5 = opt->use_reserved_5;
  local_78.use_reserved_6 = opt->use_reserved_6;
  local_78.use_reserved_7 = opt->use_reserved_7;
  local_78.use_reserved_8 = opt->use_reserved_8;
  local_78.use_reserved_9 = opt->use_reserved_9;
  local_78.use_reserved_10 = opt->use_reserved_10;
  local_78.use_reserved_11 = opt->use_reserved_11;
  local_78._32_8_ = uVar18 & 0xffffffffffffff;
  local_1b0 = this;
  local_180 = opt;
  make_padding(this,bottom_blob,&local_108,&local_78);
  iVar8 = local_108.h;
  pCVar7 = local_1b0;
  iVar17 = -100;
  if ((local_108.data != (void *)0x0) && ((long)local_108.c * local_108.cstep != 0)) {
    local_1d0 = CONCAT44(local_1d0._4_4_,local_108.w);
    uVar18 = (long)(~((iVar26 + -1) * iVar14) + local_108.w) / (long)local_1b0->stride_w;
    uVar22 = uVar18 & 0xffffffff;
    uVar21 = (long)(~((iVar29 + -1) * iVar24) + local_108.h) / (long)local_1b0->stride_h;
    uVar13 = uVar21 & 0xffffffff;
    uVar28 = (long)(~((iVar2 + -1) * iVar16) + local_108.d) / (long)local_1b0->stride_d;
    uVar10 = local_1b0->kernel_w * local_1b0->kernel_h * local_1b0->kernel_d;
    __n = (size_type)(int)uVar10;
    local_1c8 = pvVar15;
    local_178 = (ulong)uVar11;
    std::vector<int,_std::allocator<int>_>::vector(&local_90,__n,&local_1d9);
    piVar9 = local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    uVar11 = (int)uVar18 + 1;
    _h = (int)uVar21 + 1;
    iVar26 = pCVar7->kernel_d;
    if (0 < iVar26) {
      iVar29 = pCVar7->dilation_h;
      iVar14 = pCVar7->kernel_w;
      iVar19 = pCVar7->dilation_w * iVar14;
      iVar24 = pCVar7->kernel_h;
      iVar16 = iVar29 * iVar24;
      iVar2 = pCVar7->dilation_d;
      iVar17 = 0;
      iVar20 = 0;
      iVar23 = 0;
      do {
        if (0 < iVar24) {
          iVar26 = 0;
          do {
            if (0 < iVar14) {
              lVar25 = 0;
              do {
                local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar17 + lVar25] = iVar20;
                iVar20 = iVar20 + pCVar7->dilation_w;
                iVar14 = pCVar7->kernel_w;
                lVar25 = lVar25 + 1;
              } while ((int)lVar25 < iVar14);
              iVar17 = iVar17 + (int)lVar25;
              iVar24 = pCVar7->kernel_h;
            }
            iVar20 = iVar20 + (iVar29 * (int)local_1d0 - iVar19);
            iVar26 = iVar26 + 1;
          } while (iVar26 < iVar24);
          iVar26 = pCVar7->kernel_d;
        }
        iVar20 = iVar20 + (iVar8 * iVar2 - iVar16) * (int)local_1d0;
        iVar23 = iVar23 + 1;
      } while (iVar23 < iVar26);
    }
    local_168 = uVar28 & 0xffffffff;
    Mat::create(top_blob,uVar11,_h,(int)uVar28 + 1,pCVar7->num_output,(size_t)local_1c8,
                local_180->blob_allocator);
    local_120 = top_blob->data;
    iVar17 = -100;
    if ((local_120 != (void *)0x0) &&
       (local_1d8 = top_blob->cstep, (long)top_blob->c * local_1d8 != 0)) {
      uVar3 = pCVar7->group;
      uVar12 = (uint)local_178;
      local_118 = uVar13;
      local_110 = uVar22;
      if (uVar3 == pCVar7->num_output && uVar12 == uVar3) {
        if (0 < (int)uVar12) {
          local_1d8 = local_1d8 * top_blob->elemsize;
          pvVar15 = (pCVar7->weight_data).data;
          local_148 = local_108.data;
          local_1c0 = local_108.cstep *
                      CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
          local_1b8 = (long)local_108.w *
                      CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
          local_170 = (long)local_108.h * local_1b8;
          local_190 = (float *)(long)(int)uVar11;
          local_160 = (ulong)_h;
          uVar18 = (ulong)uVar11;
          uVar21 = 0;
          local_158 = uVar18;
          do {
            if (-1 < (int)local_168) {
              local_1a8 = (void *)(local_1c0 * uVar21 + (long)local_148);
              pvVar30 = (void *)(local_1d8 * uVar21 + (long)local_120);
              local_1a0 = 0;
              local_1d0 = uVar21;
              do {
                if (-1 < (int)uVar13) {
                  iVar26 = local_1b0->bias_term;
                  iVar29 = local_1b0->activation_type;
                  local_b8._0_8_ =
                       (void *)((long)(int)local_1a0 * (long)local_1b0->stride_d * local_170 +
                               (long)local_1a8);
                  iVar14 = local_1b0->stride_w;
                  local_198 = (long)local_1b0->stride_h * local_1b8;
                  local_188 = 0;
                  local_1c8 = (void *)CONCAT44(local_1c8._4_4_,iVar26);
                  do {
                    if (-1 < (int)uVar22) {
                      pfVar4 = (float *)(local_1b0->activation_params).data;
                      pvVar5 = (local_1b0->bias_data).data;
                      local_180 = (Option *)(local_188 * local_198 + local_b8._0_8_);
                      uVar28 = 0;
                      do {
                        if (iVar26 == 0) {
                          fVar32 = 0.0;
                        }
                        else {
                          fVar32 = *(float *)((long)pvVar5 + uVar21 * 4);
                        }
                        if (0 < (int)uVar10) {
                          uVar13 = 0;
                          do {
                            fVar32 = fVar32 + *(float *)((long)pvVar15 + uVar13 * 4) *
                                              *(float *)(&local_180->lightmode +
                                                        (long)piVar9[uVar13] * 4 +
                                                        uVar28 * (long)iVar14 * 4);
                            uVar13 = uVar13 + 1;
                          } while (uVar10 != uVar13);
                        }
                        fVar33 = fVar32;
                        switch(iVar29) {
                        case 1:
                          if (fVar32 <= 0.0) {
                            fVar33 = 0.0;
                          }
                          break;
                        case 2:
                          fVar33 = (float)(~-(uint)(0.0 < fVar32) & (uint)*pfVar4 |
                                          -(uint)(0.0 < fVar32) & 0x3f800000) * fVar32;
                          break;
                        case 3:
                          if (fVar32 <= *pfVar4) {
                            fVar32 = *pfVar4;
                          }
                          fVar33 = fVar32;
                          if (pfVar4[1] <= fVar32) {
                            fVar33 = pfVar4[1];
                          }
                          break;
                        case 4:
                          fVar32 = expf(-fVar32);
                          uVar18 = local_158;
                          uVar21 = local_1d0;
                          iVar26 = (int)local_1c8;
                          fVar33 = 1.0 / (fVar32 + 1.0);
                          break;
                        case 5:
                          local_138 = ZEXT416((uint)fVar32);
                          fVar32 = expf(fVar32);
                          fVar32 = logf(fVar32 + 1.0);
                          fVar32 = tanhf(fVar32);
                          uVar18 = local_158;
                          uVar21 = local_1d0;
                          iVar26 = (int)local_1c8;
                          fVar33 = fVar32 * (float)local_138._0_4_;
                          break;
                        case 6:
                          fVar1 = *pfVar4;
                          fVar31 = -pfVar4[1] / fVar1;
                          fVar33 = 0.0;
                          if ((fVar31 <= fVar32) &&
                             (fVar33 = fVar32, fVar32 <= fVar31 + 1.0 / fVar1)) {
                            fVar33 = (fVar1 * fVar32 + pfVar4[1]) * fVar32;
                          }
                        }
                        *(float *)((long)pvVar30 + uVar28 * 4) = fVar33;
                        uVar28 = uVar28 + 1;
                      } while (uVar28 != uVar18);
                    }
                    pvVar30 = (void *)((long)pvVar30 + (long)local_190 * 4);
                    local_188 = local_188 + 1;
                    uVar22 = local_110;
                  } while (local_188 != local_160);
                }
                iVar26 = (int)local_1a0;
                local_1a0 = (ulong)(iVar26 + 1);
                uVar13 = local_118;
              } while (iVar26 != (int)local_168);
            }
            uVar21 = uVar21 + 1;
            pvVar15 = (void *)((long)pvVar15 + __n * 4);
          } while (uVar21 != local_178);
        }
      }
      else {
        uVar18 = (long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 | local_178 & 0xffffffff) /
                 (long)(int)uVar3;
        if (0 < (int)uVar3) {
          uVar28 = uVar18 & 0xffffffff;
          uVar21 = (long)pCVar7->num_output / (long)(int)uVar3;
          local_170 = uVar21 & 0xffffffff;
          local_1d8 = local_1d8 * top_blob->elemsize;
          local_a0 = (pCVar7->weight_data).data;
          iVar26 = (int)uVar18 * uVar10;
          local_1a0 = (ulong)(int)uVar11;
          local_13c = (int)uVar21;
          local_a8 = (long)local_13c;
          local_13c = local_13c * iVar26;
          local_178 = (long)iVar26 << 2;
          local_1c0 = 0;
          local_150 = 0;
          local_160 = CONCAT44(local_160._4_4_,(int)uVar18);
          local_98 = (ulong)uVar3;
          do {
            if (0 < (int)local_170) {
              local_138._0_8_ = (void *)((long)local_a0 + (long)(int)local_1c0 * 4);
              local_148 = (void *)(local_150 * local_a8);
              iVar29 = (int)uVar28;
              iVar26 = (int)local_150;
              local_1b8 = 0;
              do {
                if (-1 < (int)local_168) {
                  local_188 = local_1b8 + (long)local_148;
                  local_1e8 = (void *)(local_1d8 * local_188 + (long)local_120);
                  local_1a8 = (void *)0x0;
                  do {
                    if (-1 < (int)uVar13) {
                      local_180 = (Option *)CONCAT44(local_180._4_4_,local_1b0->bias_term);
                      iVar14 = local_1b0->activation_type;
                      local_198 = 0;
                      do {
                        if (-1 < (int)uVar22) {
                          local_190 = (float *)(local_1b0->activation_params).data;
                          local_1c8 = (local_1b0->bias_data).data;
                          lVar25 = (long)local_108.w *
                                   CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize)
                          ;
                          lVar27 = local_108.cstep *
                                   CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize)
                          ;
                          local_1d0 = (long)local_108.data +
                                      (long)(int)local_198 * (long)local_1b0->stride_h * lVar25 +
                                      local_108.h * lVar25 *
                                      (long)(int)local_1a8 * (long)local_1b0->stride_d;
                          local_158 = (ulong)local_1b0->stride_w;
                          uVar21 = 0;
                          do {
                            if ((int)local_180 == 0) {
                              fVar32 = 0.0;
                            }
                            else {
                              fVar32 = *(float *)((long)local_1c8 + local_188 * 4);
                            }
                            if (0 < (int)uVar28) {
                              uVar13 = 0;
                              lVar25 = local_138._0_8_;
                              do {
                                if (0 < (int)uVar10) {
                                  uVar22 = 0;
                                  do {
                                    fVar32 = fVar32 + *(float *)(lVar25 + uVar22 * 4) *
                                                      *(float *)(local_1d0 +
                                                                (long)piVar9[uVar22] * 4 +
                                                                (uVar13 + (uint)(iVar29 * iVar26)) *
                                                                lVar27 + uVar21 * local_158 * 4);
                                    uVar22 = uVar22 + 1;
                                  } while (uVar10 != uVar22);
                                }
                                uVar13 = uVar13 + 1;
                                lVar25 = lVar25 + __n * 4;
                              } while (uVar13 != (uVar18 & 0xffffffff));
                            }
                            fVar33 = fVar32;
                            switch(iVar14) {
                            case 1:
                              if (fVar32 <= 0.0) {
                                fVar33 = 0.0;
                              }
                              break;
                            case 2:
                              fVar33 = (float)(~-(uint)(0.0 < fVar32) & (uint)*local_190 |
                                              -(uint)(0.0 < fVar32) & 0x3f800000) * fVar32;
                              break;
                            case 3:
                              if (fVar32 <= *local_190) {
                                fVar32 = *local_190;
                              }
                              fVar33 = fVar32;
                              if (local_190[1] <= fVar32) {
                                fVar33 = local_190[1];
                              }
                              break;
                            case 4:
                              fVar32 = expf(-fVar32);
                              uVar28 = local_160 & 0xffffffff;
                              fVar33 = 1.0 / (fVar32 + 1.0);
                              break;
                            case 5:
                              local_b8 = ZEXT416((uint)fVar32);
                              fVar32 = expf(fVar32);
                              fVar32 = logf(fVar32 + 1.0);
                              fVar32 = tanhf(fVar32);
                              uVar28 = local_160 & 0xffffffff;
                              fVar33 = fVar32 * (float)local_b8._0_4_;
                              break;
                            case 6:
                              fVar1 = *local_190;
                              fVar31 = -local_190[1] / fVar1;
                              fVar33 = 0.0;
                              if ((fVar31 <= fVar32) &&
                                 (fVar33 = fVar32, fVar32 <= fVar31 + 1.0 / fVar1)) {
                                fVar33 = (fVar1 * fVar32 + local_190[1]) * fVar32;
                              }
                            }
                            *(float *)((long)local_1e8 + uVar21 * 4) = fVar33;
                            uVar21 = uVar21 + 1;
                          } while (uVar21 != uVar11);
                        }
                        local_1e8 = (void *)((long)local_1e8 + local_1a0 * 4);
                        iVar24 = (int)local_198;
                        local_198 = (ulong)(iVar24 + 1);
                        uVar13 = local_118;
                        uVar22 = local_110;
                      } while (iVar24 != (int)local_118);
                    }
                    iVar14 = (int)local_1a8;
                    local_1a8 = (void *)(ulong)(iVar14 + 1);
                  } while (iVar14 != (int)local_168);
                }
                local_1b8 = local_1b8 + 1;
                local_138._0_8_ = local_138._0_8_ + local_178;
              } while (local_1b8 != local_170);
            }
            local_150 = local_150 + 1;
            local_1c0 = (ulong)(uint)((int)local_1c0 + local_13c);
          } while (local_150 != local_98);
        }
      }
      iVar17 = 0;
    }
    if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  piVar6 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_108.allocator == (Allocator *)0x0) {
        if (local_108.data != (void *)0x0) {
          free(local_108.data);
        }
      }
      else {
        (*(local_108.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar17;
}

Assistant:

int ConvolutionDepthWise3D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extend_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extend_h = dilation_h * (kernel_h - 1) + 1;
    const int kernel_extend_d = dilation_d * (kernel_d - 1) + 1;

    Mat bottom_blob_bordered;
    Option opt_pad = opt;
    opt_pad.use_packing_layout = false;
    make_padding(bottom_blob, bottom_blob_bordered, opt_pad);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    d = bottom_blob_bordered.d;

    int outw = (w - kernel_extend_w) / stride_w + 1;
    int outh = (h - kernel_extend_h) / stride_h + 1;
    int outd = (d - kernel_extend_d) / stride_d + 1;

    const int maxk = kernel_w * kernel_h * kernel_d;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap0 = w * dilation_h - kernel_w * dilation_w;
        int gap1 = h * w * dilation_d - w * kernel_h * dilation_h;
        for (int z = 0; z < kernel_d; z++)
        {
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2 += dilation_w;
                }
                p2 += gap0;
            }
            p2 += gap1;
        }
    }

    top_blob.create(outw, outh, outd, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            float* outptr = top_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            const Mat m = bottom_blob_bordered.channel(g);

            for (int z = 0; z < outd; z++)
            {
                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                            sum = bias_data[g];

                        const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[space_ofs[k]];
                            float w = kptr[k];
                            sum += val * w;
                        }

                        outptr[j] = activation_ss(sum, activation_type, activation_params);
                    }

                    outptr += outw;
                }
            }
        }
    }
    else
    {
        // group convolution
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < num_output_g; p++)
            {
                float* outptr = top_blob.channel(g * num_output_g + p);
                const float* weight_data_ptr = (const float*)weight_data + maxk * channels_g * num_output_g * g;

#if NCNN_SIMPLEOMP
                // shadowed variable for less openmp task args
                const int outw = top_blob.w;
                const int outh = top_blob.h;
                const int outd = top_blob.d;
#endif

                for (int z = 0; z < outd; z++)
                {
                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            float sum = 0.f;

                            if (bias_term)
                                sum = bias_data[num_output_g * g + p];

                            const float* kptr = weight_data_ptr + maxk * channels_g * p;

                            for (int q = 0; q < channels_g; q++)
                            {
                                const Mat m = bottom_blob_bordered.channel(channels_g * g + q);
                                const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                                for (int l = 0; l < maxk; l++)
                                {
                                    float val = sptr[space_ofs[l]];

                                    float wt = kptr[l];
                                    sum += val * wt;
                                }

                                kptr += maxk;
                            }

                            outptr[j] = activation_ss(sum, activation_type, activation_params);
                        }

                        outptr += outw;
                    }
                }
            }
        }
    }

    return 0;
}